

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finder.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
boyer_moore_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
::operator()(boyer_moore_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
             *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *state)

{
  code *pcVar1;
  char *pcVar2;
  uchar *puVar3;
  
  pcVar1 = (code *)(this->bm_).find_fun_;
  puVar3 = (this->bm_).offsets_ + *(long *)&(this->bm_).field_0x30 + -0x39;
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)puVar3 + -1);
  }
  pcVar2 = (char *)(*pcVar1)(puVar3,(state->cur_)._M_current,(state->end_)._M_current,
                             (state->context_).traits_ + 1);
  (state->cur_)._M_current = pcVar2;
  return pcVar2 != (state->end_)._M_current;
}

Assistant:

bool operator ()(match_state<BidiIter> &state) const
    {
        Traits const &tr = traits_cast<Traits>(state);
        state.cur_ = this->bm_.find(state.cur_, state.end_, tr);
        return state.cur_ != state.end_;
    }